

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O3

void ncnn::draw_text_c4(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uchar *resized_font_bitmap;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uchar *puVar12;
  ulong uVar13;
  uchar *puVar14;
  long lVar15;
  
  iVar4 = fontpixelsize * 2;
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(iVar4 * fontpixelsize));
  sVar7 = strlen(text);
  if (0 < (int)(uint)sVar7) {
    uVar9 = 0;
    uVar6 = x;
    do {
      cVar1 = text[uVar9];
      if (cVar1 == ' ') {
        uVar11 = uVar6 + fontpixelsize;
      }
      else if (cVar1 == '\n') {
        y = y + iVar4;
        uVar11 = x;
      }
      else {
        iVar5 = isprint((int)cVar1);
        uVar11 = uVar6;
        if (iVar5 != 0) {
          resize_bilinear_font
                    ((uchar *)((long)cVar1 * 400 + 0x5a74c0),resized_font_bitmap,fontpixelsize);
          uVar10 = 0;
          if (0 < y) {
            uVar10 = y;
          }
          uVar2 = y + iVar4;
          if (h <= y + iVar4) {
            uVar2 = h;
          }
          uVar8 = 0;
          if (0 < (int)uVar6) {
            uVar8 = (ulong)uVar6;
          }
          uVar11 = uVar6 + fontpixelsize;
          uVar3 = w;
          if ((int)uVar11 < w) {
            uVar3 = uVar11;
          }
          if ((int)uVar10 < (int)uVar2) {
            iVar5 = (int)uVar8;
            uVar13 = (ulong)uVar10;
            puVar12 = pixels + (long)stride * uVar13 + (ulong)(uint)(iVar5 * 4);
            puVar14 = resized_font_bitmap +
                      (((uVar13 - (long)y) * (long)fontpixelsize + uVar8) - (long)(int)uVar6);
            do {
              if (iVar5 < (int)uVar3) {
                lVar15 = 0;
                do {
                  uVar10 = (uint)puVar14[lVar15];
                  uVar6 = uVar10 ^ 0xff;
                  puVar12[lVar15 * 4] =
                       (uchar)((ulong)((color & 0xff) * (uint)puVar14[lVar15] +
                                      puVar12[lVar15 * 4] * uVar6) * 0x1010102 >> 0x20);
                  puVar12[lVar15 * 4 + 1] =
                       (uchar)((ulong)((color >> 8 & 0xff) * uVar10 +
                                      puVar12[lVar15 * 4 + 1] * uVar6) * 0x1010102 >> 0x20);
                  puVar12[lVar15 * 4 + 2] =
                       (uchar)((ulong)((color >> 0x10 & 0xff) * uVar10 +
                                      puVar12[lVar15 * 4 + 2] * uVar6) * 0x1010102 >> 0x20);
                  puVar12[lVar15 * 4 + 3] =
                       (uchar)((ulong)(uVar10 * (color >> 0x18) + puVar12[lVar15 * 4 + 3] * uVar6) *
                               0x1010102 >> 0x20);
                  lVar15 = lVar15 + 1;
                } while (uVar3 - iVar5 != (int)lVar15);
              }
              uVar13 = uVar13 + 1;
              puVar12 = puVar12 + stride;
              puVar14 = puVar14 + fontpixelsize;
            } while (uVar13 != uVar2);
          }
        }
      }
      uVar6 = uVar11;
      uVar9 = uVar9 + 1;
    } while (uVar9 != ((uint)sVar7 & 0x7fffffff));
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c4(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart * 4;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p[1] = (p[1] * (255 - alpha) + pen_color[1] * alpha) / 255;
                    p[2] = (p[2] * (255 - alpha) + pen_color[2] * alpha) / 255;
                    p[3] = (p[3] * (255 - alpha) + pen_color[3] * alpha) / 255;
                    p += 4;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}